

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void freelev(xchar levnum)

{
  level *lev;
  trap *ptVar1;
  mon_gen_override *__ptr;
  mon_gen_tuple *pmVar2;
  lvl_sounds *__ptr_00;
  damage *pdVar3;
  trap *__ptr_01;
  mon_gen_tuple *__ptr_02;
  damage *__ptr_03;
  int iVar4;
  undefined7 in_register_00000039;
  lvl_sound_bite *__ptr_04;
  long lVar5;
  long lVar6;
  
  iVar4 = (int)CONCAT71(in_register_00000039,levnum);
  lev = levels[iVar4];
  free_timers(lev);
  free_light_sources(lev);
  free_monchn(lev->monlist);
  free_worm(lev);
  __ptr_01 = lev->lev_traps;
  while (__ptr_01 != (trap *)0x0) {
    ptVar1 = __ptr_01->ntrap;
    free(__ptr_01);
    __ptr_01 = ptVar1;
  }
  free_objchn(lev->objlist);
  free_objchn(lev->buriedobjlist);
  free_objchn(lev->billobjs);
  __ptr = lev->mon_gen;
  if (__ptr != (mon_gen_override *)0x0) {
    __ptr_02 = __ptr->gen_chances;
    while (__ptr_02 != (mon_gen_tuple *)0x0) {
      pmVar2 = __ptr_02->next;
      free(__ptr_02);
      __ptr_02 = pmVar2;
    }
    free(__ptr);
  }
  __ptr_00 = lev->sounds;
  if (__ptr_00 != (lvl_sounds *)0x0) {
    __ptr_04 = __ptr_00->sounds;
    if (0 < __ptr_00->n_sounds) {
      lVar5 = 8;
      lVar6 = 0;
      do {
        free(*(void **)((long)&__ptr_04->flags + lVar5));
        __ptr_04 = __ptr_00->sounds;
        *(undefined8 *)((long)&__ptr_04->flags + lVar5) = 0;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar6 < __ptr_00->n_sounds);
    }
    free(__ptr_04);
    free(__ptr_00);
  }
  lev->lev_traps = (trap *)0x0;
  lev->billobjs = (obj *)0x0;
  lev->monlist = (monst *)0x0;
  lev->objlist = (obj *)0x0;
  lev->buriedobjlist = (obj *)0x0;
  lev->mon_gen = (mon_gen_override *)0x0;
  lev->sounds = (lvl_sounds *)0x0;
  free_engravings(lev);
  __ptr_03 = lev->damagelist;
  while (__ptr_03 != (damage *)0x0) {
    pdVar3 = __ptr_03->next;
    free(__ptr_03);
    __ptr_03 = pdVar3;
  }
  lev->damagelist = (damage *)0x0;
  free_regions(lev);
  free(lev);
  levels[iVar4] = (level *)0x0;
  return;
}

Assistant:

void freelev(xchar levnum)
{
	struct level *lev = levels[levnum];
	
	/* must be freed before mons, objs, and buried objs */
	free_timers(lev);
	free_light_sources(lev);

	free_monchn(lev->monlist);
	free_worm(lev);
	freetrapchn(lev->lev_traps);
	free_objchn(lev->objlist);
	free_objchn(lev->buriedobjlist);
	free_objchn(lev->billobjs);
	free_mongen_override(lev->mon_gen);
	free_lvl_sounds(lev->sounds);

	lev->monlist = NULL;
	lev->lev_traps = NULL;
	lev->objlist = NULL;
	lev->buriedobjlist = NULL;
	lev->billobjs = NULL;
	lev->mon_gen = NULL;
	lev->sounds = NULL;

	free_engravings(lev);
	freedamage(lev);
	free_regions(lev);
	
	free(lev);
	levels[levnum] = NULL;
}